

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

CURLcode ws_send_raw_blocking(CURL *data,websocket *ws,char *buffer,size_t buflen)

{
  int iVar1;
  timediff_t local_60;
  int ev;
  timediff_t left_ms;
  size_t sStack_40;
  curl_socket_t sock;
  size_t nwritten;
  size_t sStack_30;
  CURLcode result;
  size_t buflen_local;
  char *buffer_local;
  websocket *ws_local;
  CURL *data_local;
  
  nwritten._4_4_ = CURLE_OK;
  sStack_30 = buflen;
  buflen_local = (size_t)buffer;
  buffer_local = (char *)ws;
  ws_local = (websocket *)data;
  do {
    do {
      if (sStack_30 == 0) {
        return nwritten._4_4_;
      }
      nwritten._4_4_ =
           Curl_xfer_send((Curl_easy *)ws_local,(void *)buflen_local,sStack_30,false,
                          &stack0xffffffffffffffc0);
      if (nwritten._4_4_ != CURLE_OK) {
        return nwritten._4_4_;
      }
      buflen_local = sStack_40 + buflen_local;
      sStack_30 = sStack_30 - sStack_40;
    } while (sStack_30 == 0);
    iVar1 = *(int *)((ws_local->dec).payload_len + 0x238);
    if ((((ws_local != (websocket *)0x0) &&
         ((*(ulong *)((long)&ws_local[10].frame.bytesleft + 2) >> 0x1c & 1) != 0)) &&
        ((ws_local[0x13].sendbuf.max_chunks == 0 ||
         (0 < *(int *)(ws_local[0x13].sendbuf.max_chunks + 8))))) &&
       (0 < Curl_trc_feat_ws.log_level)) {
      Curl_trc_ws((Curl_easy *)ws_local,"ws_send_raw_blocking() partial, %zu left to send",sStack_30
                 );
    }
    local_60 = Curl_timeleft((Curl_easy *)ws_local,(curltime *)0x0,false);
    if (local_60 < 0) {
      Curl_failf((Curl_easy *)ws_local,"Timeout waiting for socket becoming writable");
      return CURLE_SEND_ERROR;
    }
    if (iVar1 == -1) {
      return CURLE_SEND_ERROR;
    }
    if (local_60 == 0) {
      local_60 = 500;
    }
    iVar1 = Curl_socket_check(-1,-1,iVar1,local_60);
  } while (-1 < iVar1);
  Curl_failf((Curl_easy *)ws_local,"Error while waiting for socket becoming writable");
  return CURLE_SEND_ERROR;
}

Assistant:

static CURLcode ws_send_raw_blocking(CURL *data, struct websocket *ws,
                                     const char *buffer, size_t buflen)
{
  CURLcode result = CURLE_OK;
  size_t nwritten;

  (void)ws;
  while(buflen) {
    result = Curl_xfer_send(data, buffer, buflen, FALSE, &nwritten);
    if(result)
      return result;
    DEBUGASSERT(nwritten <= buflen);
    buffer += nwritten;
    buflen -= nwritten;
    if(buflen) {
      curl_socket_t sock = data->conn->sock[FIRSTSOCKET];
      timediff_t left_ms;
      int ev;

      CURL_TRC_WS(data, "ws_send_raw_blocking() partial, %zu left to send",
                  buflen);
      left_ms = Curl_timeleft(data, NULL, FALSE);
      if(left_ms < 0) {
        failf(data, "Timeout waiting for socket becoming writable");
        return CURLE_SEND_ERROR;
      }

      /* POLLOUT socket */
      if(sock == CURL_SOCKET_BAD)
        return CURLE_SEND_ERROR;
      ev = Curl_socket_check(CURL_SOCKET_BAD, CURL_SOCKET_BAD, sock,
                             left_ms ? left_ms : 500);
      if(ev < 0) {
        failf(data, "Error while waiting for socket becoming writable");
        return CURLE_SEND_ERROR;
      }
    }
  }
  return result;
}